

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
GraphContigger::end_to_end_solution
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,GraphContigger *this,
          vector<long,_std::allocator<long>_> *p,vector<long,_std::allocator<long>_> *fnids)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer plVar3;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var4;
  long *plVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  GraphContigger *pGVar13;
  long lVar14;
  _Rb_tree_header *p_Var15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  vector<long,_std::allocator<long>_> sol;
  vector<long,_std::allocator<long>_> csol;
  value_type n;
  vector<long,_std::allocator<long>_> a;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_2;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_1;
  set<long,_std::less<long>,_std::allocator<long>_> fw_skipped;
  vector<long,_std::allocator<long>_> local_178;
  pointer local_158;
  iterator iStack_150;
  long *local_148;
  long local_138;
  vector<long,_std::allocator<long>_> *local_130;
  int local_124;
  GraphContigger *local_120;
  long *local_118;
  long *plStack_110;
  long *local_108;
  long local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_f0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_90;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  plVar3 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar18 = 2;
  local_130 = __return_storage_ptr__;
  if ((p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish
      != plVar3) {
    lVar11 = 0;
    uVar12 = 0;
    local_120 = this;
    do {
      local_c0._M_impl._0_8_ = -plVar3[uVar12];
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                        ((fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_finish,&local_c0);
      if (_Var4._M_current !=
          (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_finish) {
        lVar14 = -lVar11;
        lVar11 = -lVar11;
        uVar16 = uVar12 + 1;
        goto LAB_001e97bc;
      }
      uVar12 = uVar12 + 1;
      plVar3 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar11 = lVar11 + -8;
    } while (uVar12 < (ulong)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)plVar3 >> 3));
    iVar18 = 2;
  }
  goto LAB_001e9d69;
  while( true ) {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                      ((fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_finish,(long)plVar3 + lVar14);
    uVar16 = uVar17 + 1;
    if (_Var4._M_current !=
        (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish) break;
LAB_001e97bc:
    uVar17 = uVar16;
    lVar14 = lVar14 + 8;
    plVar3 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((ulong)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)plVar3 >> 3) <= uVar17) {
      iVar18 = 5;
      goto LAB_001e9d4c;
    }
  }
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  plVar3 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = plVar3[uVar12];
  uVar9 = -uVar8;
  if (0 < (long)uVar8) {
    uVar9 = uVar8;
  }
  uVar17 = plVar3[uVar17];
  uVar8 = -uVar17;
  if (0 < (long)uVar17) {
    uVar8 = uVar17;
  }
  if (uVar9 < uVar8) {
    if ((uint)uVar12 < (uint)uVar16) {
      uVar16 = uVar16 & 0xffffffff;
      do {
        plVar10 = (long *)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar11);
        if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_178,
                     (iterator)
                     local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,plVar10);
        }
        else {
          *local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish = *plVar10;
          local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        lVar11 = lVar11 + 8;
        uVar16 = uVar16 - 1;
      } while (uVar12 != uVar16);
    }
  }
  else {
    if ((uint)uVar12 < (uint)uVar16) {
      uVar17 = uVar12;
      do {
        local_c0._M_impl._0_8_ =
             -(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
              _M_start[uVar17];
        if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&local_178,
                     (iterator)
                     local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)&local_c0);
        }
        else {
          *local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish = local_c0._M_impl._0_8_;
          local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar17 = uVar17 + 1;
      } while ((uVar16 & 0xffffffff) != uVar17);
    }
    plVar3 = local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    plVar10 = local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start < plVar3 &&
        local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        plVar5 = plVar10 + 1;
        lVar11 = *plVar10;
        *plVar10 = *plVar3;
        *plVar3 = lVar11;
        plVar3 = plVar3 + -1;
        plVar10 = plVar5;
      } while (plVar5 < plVar3);
    }
  }
  local_158 = (pointer)0x0;
  iStack_150._M_current = (long *)0x0;
  local_148 = (long *)0x0;
  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
            ((vector<long,std::allocator<long>> *)&local_158,(iterator)0x0,
             local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (uVar12 < (ulong)((long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3)) {
    lVar11 = 1;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    pGVar13 = local_120;
    do {
      p_Var15 = &local_c0._M_impl.super__Rb_tree_header;
      local_138 = local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
      DistanceGraph::fw_reached_nodes
                ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_c0,
                 *(DistanceGraph **)pGVar13,iStack_150._M_current[-1],1);
      DistanceGraph::fw_reached_nodes
                ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_f0,
                 *(DistanceGraph **)pGVar13,iStack_150._M_current[-1],2);
      lVar2 = local_138;
      lVar14 = local_138;
      p_Var7 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((local_138 = lVar14, local_f0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var7,
             (_Rb_tree_header *)p_Var6 != p_Var15 && (*(long *)(p_Var6 + 1) != lVar2))) {
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        lVar14 = local_138;
        p_Var7 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      local_f8 = lVar11;
      if ((_Rb_tree_header *)p_Var6 == p_Var15) {
        if ((_Rb_tree_header *)p_Var7 != &local_f0._M_impl.super__Rb_tree_header) {
          do {
            if (*(long *)(p_Var7 + 1) == lVar14) break;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          } while ((_Rb_tree_header *)p_Var7 != &local_f0._M_impl.super__Rb_tree_header);
        }
        if ((_Rb_tree_header *)p_Var7 == &local_f0._M_impl.super__Rb_tree_header) {
          (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_start =
               local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
          (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish =
               local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          iVar18 = 1;
        }
        else {
          local_118 = (long *)0x0;
          plStack_110 = (long *)0x0;
          local_108 = (long *)0x0;
          DistanceGraph::fw_reached_nodes
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_90,
                     *(DistanceGraph **)pGVar13,iStack_150._M_current[-1],1);
          local_124 = 0;
          bVar19 = (_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left ==
                   &local_90._M_impl.super__Rb_tree_header;
          p_Var7 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          while (!bVar19) {
            DistanceGraph::fw_reached_nodes
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,
                       *(DistanceGraph **)pGVar13,*(sgNodeID_t *)(p_Var7 + 1),1);
            lVar11 = local_138;
            for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
                ((_Rb_tree_header *)p_Var6 != p_Var1 && (*(long *)(p_Var6 + 1) != lVar11));
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            }
            if ((_Rb_tree_header *)p_Var6 != p_Var1) {
              if (plStack_110 == local_108) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          ((vector<long,std::allocator<long>> *)&local_118,(iterator)plStack_110,
                           (long *)(p_Var7 + 1));
              }
              else {
                *plStack_110 = *(long *)(p_Var7 + 1);
                plStack_110 = plStack_110 + 1;
              }
            }
            lVar11 = (long)plStack_110 - (long)local_118;
            if (lVar11 == 8) {
              if (iStack_150._M_current == local_148) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          ((vector<long,std::allocator<long>> *)&local_158,iStack_150,local_118);
              }
              else {
                *iStack_150._M_current = *local_118;
                iStack_150._M_current = iStack_150._M_current + 1;
              }
              if (iStack_150._M_current == local_148) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          ((vector<long,std::allocator<long>> *)&local_158,iStack_150,&local_138);
              }
              else {
                *iStack_150._M_current = local_138;
                iStack_150._M_current = iStack_150._M_current + 1;
              }
            }
            else {
              (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_start =
                   local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_finish =
                   local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            }
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&local_60);
            if (lVar11 != 8) {
              local_124 = 1;
              pGVar13 = local_120;
              break;
            }
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
            pGVar13 = local_120;
            bVar19 = (_Rb_tree_header *)p_Var7 == &local_90._M_impl.super__Rb_tree_header;
          }
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&local_90);
          if (local_118 != (long *)0x0) {
            operator_delete(local_118,(long)local_108 - (long)local_118);
          }
          iVar18 = local_124;
          if (bVar19) goto LAB_001e9ca2;
        }
      }
      else {
        if (iStack_150._M_current == local_148) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_158,iStack_150,&local_138);
        }
        else {
          *iStack_150._M_current = lVar14;
          iStack_150._M_current = iStack_150._M_current + 1;
        }
LAB_001e9ca2:
        iVar18 = 0;
      }
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&local_f0);
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&local_c0);
      if (iVar18 != 0) goto LAB_001e9ce9;
      lVar11 = local_f8 + 1;
    } while (uVar12 < (ulong)((long)local_178.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_178.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  iVar18 = 0xe;
LAB_001e9ce9:
  if (iVar18 == 0xe) {
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_158;
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iStack_150._M_current;
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_148;
    local_158 = (pointer)0x0;
    iStack_150._M_current = (long *)0x0;
    local_148 = (long *)0x0;
    iVar18 = 1;
  }
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_001e9d4c:
  if (iVar18 == 5) {
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar18 = 1;
  }
LAB_001e9d69:
  if (iVar18 == 2) {
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (local_130->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  return local_130;
}

Assistant:

std::vector<sgNodeID_t> GraphContigger::end_to_end_solution(std::vector<sgNodeID_t> p, std::vector<sgNodeID_t> fnids){
    for (auto i=0; i<p.size(); ++i){
        if (std::find(fnids.begin(), fnids.end(), -p[i]) != fnids.end()) {
            for (auto j=i+1; j<p.size(); ++j) {
                if (std::find(fnids.begin(), fnids.end(), p[j])!=fnids.end()){
                    std::vector<sgNodeID_t> sol;
                    if (std::abs(p[i])<std::abs(p[j])){
                        for (auto x=i; x<j+1; ++x) sol.push_back(p[x]);
                    } else {
                        for (auto x=i; x<j+1; ++x) sol.push_back(-p[x]);
                        std::reverse(sol.begin(), sol.end());
                    }
                    std::vector<sgNodeID_t> csol;
                    csol.push_back(sol[0]);
                    for (auto x=1; i<sol.size(); ++x){
                        auto n=sol[x];
                        auto fw_reached_nodes_1 = ws.sdg.fw_reached_nodes(csol.back(),1);
                        auto fw_reached_nodes_2 = ws.sdg.fw_reached_nodes(csol.back(),2);
                        if (std::find(fw_reached_nodes_1.begin(), fw_reached_nodes_1.end(), n)!=fw_reached_nodes_1.end()) {
                            csol.push_back(n);
                        } else if (std::find(fw_reached_nodes_2.begin(), fw_reached_nodes_2.end(), n)!=fw_reached_nodes_2.end()) {
                            std::vector<sgNodeID_t> a;
                            for (const auto& skipped: ws.sdg.fw_reached_nodes(csol.back(),1)) {
                                auto fw_skipped = ws.sdg.fw_reached_nodes(skipped,1);
                                if (std::find(fw_skipped.begin(), fw_skipped.end(), n)!=fw_skipped.end()) a.push_back(skipped);
                                if (a.size()==1) {
                                    csol.push_back(a[0]);
                                    csol.push_back(n);
                                } else {
                                    return sol;
                                }
                            }
                        } else {
//                            for (auto &s: sol) {
//                                std::cout << s << ",";
//                            }
//                            std::cout << std::endl;
                            return sol;
                        }
                    }
                    return csol;
                }
            }
            return std::vector<sgNodeID_t>();
        }
    }
    return std::vector<sgNodeID_t>();
}